

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O2

void aom_hadamard_8x8_c(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  int16_t *piVar1;
  int i;
  long lVar2;
  long lVar3;
  int16_t *coeff_00;
  int16_t buffer2 [64];
  int16_t buffer [64];
  
  coeff_00 = buffer2;
  piVar1 = buffer2;
  for (lVar3 = 0; (int)lVar3 != 0x80; lVar3 = lVar3 + 0x10) {
    hadamard_col8(src_diff,src_stride,(int16_t *)((long)buffer + lVar3));
    src_diff = src_diff + 1;
  }
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 2) {
    hadamard_col8((int16_t *)((long)buffer + lVar3),8,coeff_00);
    coeff_00 = coeff_00 + 8;
  }
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 4) {
      *(int *)((long)coeff + lVar2) = (int)*(short *)((long)piVar1 + lVar2 * 4);
    }
    coeff = coeff + 8;
    piVar1 = (int16_t *)((long)piVar1 + 2);
  }
  return;
}

Assistant:

void aom_hadamard_8x8_c(const int16_t *src_diff, ptrdiff_t src_stride,
                        tran_low_t *coeff) {
  int idx;
  int16_t buffer[64];
  int16_t buffer2[64];
  int16_t *tmp_buf = &buffer[0];
  for (idx = 0; idx < 8; ++idx) {
    hadamard_col8(src_diff, src_stride, tmp_buf);  // src_diff: 9 bit
                                                   // dynamic range [-255, 255]
    tmp_buf += 8;
    ++src_diff;
  }

  tmp_buf = &buffer[0];
  for (idx = 0; idx < 8; ++idx) {
    hadamard_col8(tmp_buf, 8, buffer2 + 8 * idx);  // tmp_buf: 12 bit
    // dynamic range [-2040, 2040]
    // buffer2: 15 bit
    // dynamic range [-16320, 16320]
    ++tmp_buf;
  }

  // Extra transpose to match SSE2 behavior(i.e., aom_hadamard_8x8_sse2).
  for (int i = 0; i < 8; i++) {
    for (int j = 0; j < 8; j++) {
      coeff[i * 8 + j] = (tran_low_t)buffer2[j * 8 + i];
    }
  }
}